

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EthBasePort.cpp
# Opt level: O0

bool __thiscall
EthBasePort::WriteBlockNode
          (EthBasePort *this,nodeid_t node,nodeaddr_t addr,quadlet_t *wdata,uint nbytes,uchar flags)

{
  uchar *puVar1;
  quadlet_t *pqVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  byte local_89;
  uchar *wdata_base;
  size_t packetSize;
  uchar *packet;
  allocator<char> local_59;
  string local_58 [35];
  byte local_35;
  uint local_34;
  uchar flags_local;
  quadlet_t *pqStack_30;
  uint nbytes_local;
  quadlet_t *wdata_local;
  nodeaddr_t addr_local;
  EthBasePort *pEStack_18;
  nodeid_t node_local;
  EthBasePort *this_local;
  
  local_89 = 0;
  local_35 = flags;
  local_34 = nbytes;
  pqStack_30 = wdata;
  wdata_local = (quadlet_t *)addr;
  addr_local._6_2_ = node;
  pEStack_18 = this;
  if (node != 0x3f) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_58,"WriteBlock",&local_59);
    iVar3 = (*(this->super_BasePort)._vptr_BasePort[0x1b])(this,local_58,0);
    local_89 = (byte)iVar3 ^ 0xff;
    std::__cxx11::string::~string(local_58);
    std::allocator<char>::~allocator(&local_59);
  }
  if ((local_89 & 1) == 0) {
    BasePort::SetGenericBuffer(&this->super_BasePort);
    puVar1 = (this->super_BasePort).GenericBuffer;
    uVar4 = (*(this->super_BasePort)._vptr_BasePort[0x17])();
    packetSize = (size_t)(puVar1 + uVar4);
    iVar3 = (*(this->super_BasePort)._vptr_BasePort[0x14])(this,2);
    iVar3 = iVar3 + local_34;
    iVar5 = (*(this->super_BasePort)._vptr_BasePort[0x15])();
    pqVar2 = pqStack_30;
    uVar4 = iVar3 + iVar5;
    uVar6 = (*(this->super_BasePort)._vptr_BasePort[0x17])();
    uVar7 = (*(this->super_BasePort)._vptr_BasePort[0x14])(this,2);
    if ((uchar *)((long)pqVar2 + (-(ulong)uVar7 - (ulong)uVar6)) ==
        (this->super_BasePort).WriteBufferBroadcast) {
      puVar1 = (this->super_BasePort).WriteBufferBroadcast;
      uVar6 = (*(this->super_BasePort)._vptr_BasePort[0x17])();
      packetSize = (size_t)(puVar1 + uVar6);
    }
    this->fw_tl = this->fw_tl + 1 & 0x3f;
    (*(this->super_BasePort)._vptr_BasePort[0x31])
              (this,packetSize,(ulong)uVar4,(ulong)addr_local._6_2_,(ulong)local_35);
    make_write_header(this,(uchar *)packetSize,uVar4,local_35);
    uVar6 = (*(this->super_BasePort)._vptr_BasePort[0x14])(this,1);
    make_bwrite_packet(this,(quadlet_t *)(packetSize + uVar6),addr_local._6_2_,
                       (nodeaddr_t)wdata_local,pqStack_30,local_34,(uint)this->fw_tl);
    iVar3 = (*(this->super_BasePort)._vptr_BasePort[0x2d])
                      (this,(ulong)addr_local._6_2_,packetSize,(ulong)uVar4,
                       (ulong)((local_35 & 0x80) != 0));
    this_local._7_1_ = (bool)((byte)iVar3 & 1);
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool EthBasePort::WriteBlockNode(nodeid_t node, nodeaddr_t addr, quadlet_t *wdata,
                                 unsigned int nbytes, unsigned char flags)
{
    if ((node != FW_NODE_BROADCAST) && !CheckFwBusGeneration("WriteBlock"))
        return false;

    // Packet to send
    SetGenericBuffer();   // Make sure buffer is allocated
    unsigned char *packet = GenericBuffer+GetWriteQuadAlign();
    size_t packetSize = GetPrefixOffset(WR_FW_BDATA) + nbytes + GetWritePostfixSize();

    // Check for real-time write
    unsigned char *wdata_base = reinterpret_cast<unsigned char *>(wdata)-GetWriteQuadAlign()-GetPrefixOffset(WR_FW_BDATA);
    if (wdata_base == WriteBufferBroadcast) {
        packet = WriteBufferBroadcast+GetWriteQuadAlign();
    }

    // Increment transaction label
    fw_tl = (fw_tl+1)&FW_TL_MASK;

    // Make Ethernet header (only needed for raw Ethernet)
    make_ethernet_header(packet, packetSize, node, flags);

    // Make control word
    make_write_header(packet, packetSize, flags);

    // Build FireWire packet
    make_bwrite_packet(reinterpret_cast<quadlet_t *>(packet+GetPrefixOffset(WR_FW_HEADER)), node, addr, wdata, nbytes, fw_tl);

    // Now, send the packet
    return PacketSend(node, packet, packetSize, flags&FW_NODE_ETH_BROADCAST_MASK);
}